

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O2

void D_CheckNetGame(void)

{
  ushort uVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  ushort uVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  char filename [20];
  
  lVar8 = 0;
  for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
    *(undefined4 *)((long)nettics + lVar8) = 0;
    *(undefined4 *)((long)resendto + lVar8) = 0;
    nodeingame[lVar9] = false;
    remoteresend[lVar9] = false;
    lVar8 = lVar8 + 4;
  }
  pcVar3 = DArgs::CheckValue(Args,"-netmode");
  if (pcVar3 != (char *)0x0) {
    iVar2 = atoi(pcVar3);
    if (iVar2 != 0) {
      Printf(
            "\x1cKNotice: Using PacketServer (netmode 1) over the internet is prone to running too slow on some internet configurations.\nIf the game is running well below expected speeds, use netmode 0 (P2P) instead.\n"
            );
    }
  }
  I_InitNetwork();
  if (doomcom.id != 0x12345678) {
    I_FatalError("Doomcom buffer invalid!");
  }
  DAT_017dc111 = 1;
  consoleplayer = (int)doomcom.consoleplayer;
  if (Net_Arbitrator == consoleplayer) {
    pcVar3 = DArgs::CheckValue(Args,"-netmode");
    if (pcVar3 != (char *)0x0) {
      iVar2 = atoi(pcVar3);
      NetMode = iVar2 != 0;
    }
    if (1 < doomcom.numnodes) {
      pcVar7 = "packet server";
      if (NetMode == '\0') {
        pcVar7 = "peer to peer";
      }
      pcVar6 = "forced";
      if (pcVar3 == (char *)0x0) {
        pcVar6 = "auto";
      }
      Printf("Selected \x1cH%s\x1c- networking mode. (%s)\n",pcVar7,pcVar6);
    }
    iVar2 = DArgs::CheckParm(Args,"-extratic",1);
    if (iVar2 != 0) {
      FIntCVar::operator=(&net_extratic,1);
    }
  }
  D_SetupUserInfo();
  iVar2 = DArgs::CheckParm(Args,"-debugfile",1);
  if (iVar2 != 0) {
    mysnprintf(filename,0x14,"debug%i.txt",(ulong)(uint)consoleplayer);
    Printf("debug output to: %s\n",filename);
    debugfile = (FILE *)fopen(filename,"w");
  }
  if (netgame == true) {
    FGameConfigFile::ReadNetVars(GameConfig);
    D_ArbitrateNetStart();
  }
  ticdup = (int)doomcom.ticdup;
  uVar4 = 0;
  uVar5 = doomcom.numplayers;
  if (doomcom.numplayers < 1) {
    uVar5 = 0;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    playeringame[uVar4] = true;
  }
  uVar4 = 0;
  uVar1 = doomcom.numnodes;
  uVar5 = uVar1;
  if ((short)uVar1 < 1) {
    uVar5 = 0;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    nodeingame[uVar4] = true;
  }
  if ((1 < (short)uVar1) && (consoleplayer != Net_Arbitrator)) {
    pcVar3 = "packet server";
    if (NetMode == '\0') {
      pcVar3 = "peer to peer";
    }
    Printf("Arbitrator selected \x1cH%s\x1c- networking mode.\n",pcVar3);
  }
  if (batchrun == false) {
    Printf("player %i of %i (%i nodes)\n",(ulong)(consoleplayer + 1),
           (ulong)(uint)(int)doomcom.numplayers,(ulong)(uint)(int)doomcom.numnodes);
  }
  return;
}

Assistant:

void D_CheckNetGame (void)
{
	const char *v;
	int i;

	for (i = 0; i < MAXNETNODES; i++)
	{
		nodeingame[i] = false;
		nettics[i] = 0;
		remoteresend[i] = false;		// set when local needs tics
		resendto[i] = 0;				// which tic to start sending
	}

	// Packet server has proven to be rather slow over the internet. Print a warning about it.
	v = Args->CheckValue("-netmode");
	if (v != NULL && (atoi(v) != 0))
	{
		Printf(TEXTCOLOR_YELLOW "Notice: Using PacketServer (netmode 1) over the internet is prone to running too slow on some internet configurations."
			"\nIf the game is running well below expected speeds, use netmode 0 (P2P) instead.\n");
	}

	// I_InitNetwork sets doomcom and netgame
	if (I_InitNetwork ())
	{
		// For now, stop auto selecting PacketServer, as it's more likely to cause confusion.
		//NetMode = NET_PacketServer;
	}
	if (doomcom.id != DOOMCOM_ID)
	{
		I_FatalError ("Doomcom buffer invalid!");
	}
	players[0].settings_controller = true;

	consoleplayer = doomcom.consoleplayer;

	if (consoleplayer == Net_Arbitrator)
	{
		v = Args->CheckValue("-netmode");
		if (v != NULL)
		{
			NetMode = atoi(v) != 0 ? NET_PacketServer : NET_PeerToPeer;
		}
		if (doomcom.numnodes > 1)
		{
			Printf("Selected " TEXTCOLOR_BLUE "%s" TEXTCOLOR_NORMAL " networking mode. (%s)\n", NetMode == NET_PeerToPeer ? "peer to peer" : "packet server",
				v != NULL ? "forced" : "auto");
		}

		if (Args->CheckParm("-extratic"))
		{
			net_extratic = 1;
		}
	}

	// [RH] Setup user info
	D_SetupUserInfo ();

	if (Args->CheckParm ("-debugfile"))
	{
		char filename[20];
		mysnprintf (filename, countof(filename), "debug%i.txt", consoleplayer);
		Printf ("debug output to: %s\n", filename);
		debugfile = fopen (filename, "w");
	}

	if (netgame)
	{
		GameConfig->ReadNetVars ();	// [RH] Read network ServerInfo cvars
		D_ArbitrateNetStart ();
	}

	// read values out of doomcom
	ticdup = doomcom.ticdup;

	for (i = 0; i < doomcom.numplayers; i++)
		playeringame[i] = true;
	for (i = 0; i < doomcom.numnodes; i++)
		nodeingame[i] = true;

	if (consoleplayer != Net_Arbitrator && doomcom.numnodes > 1)
	{
		Printf("Arbitrator selected " TEXTCOLOR_BLUE "%s" TEXTCOLOR_NORMAL " networking mode.\n", NetMode == NET_PeerToPeer ? "peer to peer" : "packet server");
	}

	if (!batchrun) Printf ("player %i of %i (%i nodes)\n",
			consoleplayer+1, doomcom.numplayers, doomcom.numnodes);
}